

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O1

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrSecondaryViewConfigurationLayerInfoMSFT *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  XrEnvironmentBlendMode XVar3;
  XrCompositionLayerProjection *value_00;
  char cVar4;
  bool bVar5;
  char cVar6;
  NextChainResult NVar7;
  int iVar8;
  XrResult XVar9;
  XrResult XVar10;
  pointer pcVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  uint __val;
  string out;
  string local_3a0;
  string error_message;
  ios_base local_310 [264];
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1e8;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1d0;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1b8;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1a0;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_188;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_170;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_158;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_140;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_f0;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_d8;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_c0;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_a8;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_90;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_78;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_60;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_48;
  
  XVar9 = XR_SUCCESS;
  if (value->type != XR_TYPE_SECONDARY_VIEW_CONFIGURATION_LAYER_INFO_MSFT) {
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrSecondaryViewConfigurationLayerInfoMSFT",
               value->type,"VUID-XrSecondaryViewConfigurationLayerInfoMSFT-type-type",
               XR_TYPE_SECONDARY_VIEW_CONFIGURATION_LAYER_INFO_MSFT,
               "XR_TYPE_SECONDARY_VIEW_CONFIGURATION_LAYER_INFO_MSFT");
    XVar9 = XR_ERROR_VALIDATION_FAILURE;
  }
  if (check_pnext) {
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    NVar7 = ValidateNextChain(instance_info,command_name,objects_info,value->next,&valid_ext_structs
                              ,&encountered_structs,&duplicate_ext_structs);
    if (NVar7 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
      error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&error_message,
                 "Multiple structures of the same type(s) in \"next\" chain for ","");
      std::__cxx11::string::append((char *)&error_message);
      StructTypesToString_abi_cxx11_(&out,instance_info,&duplicate_ext_structs);
      std::__cxx11::string::_M_append((char *)&error_message,(ulong)out._M_dataplus._M_p);
      paVar1 = &out.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)out._M_dataplus._M_p != paVar1) {
        operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
      }
      out._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&out,"VUID-XrSecondaryViewConfigurationLayerInfoMSFT-next-unique","");
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_158,objects_info);
      local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3a0,
                 "Multiple structures of the same type(s) in \"next\" chain for XrSecondaryViewConfigurationLayerInfoMSFT struct"
                 ,"");
      CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                          &local_158,&local_3a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
      }
      if (local_158.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_158.
                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_158.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_158.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)out._M_dataplus._M_p != paVar1) {
        operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)error_message._M_dataplus._M_p != &error_message.field_2) {
LAB_0019cea2:
        operator_delete(error_message._M_dataplus._M_p,
                        error_message.field_2._M_allocated_capacity + 1);
      }
LAB_0019ceaf:
      XVar9 = XR_ERROR_VALIDATION_FAILURE;
    }
    else if (NVar7 == NEXT_CHAIN_RESULT_ERROR) {
      error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&error_message,"VUID-XrSecondaryViewConfigurationLayerInfoMSFT-next-next"
                 ,"");
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_140,objects_info);
      out._M_dataplus._M_p = (pointer)&out.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&out,
                 "Invalid structure(s) in \"next\" chain for XrSecondaryViewConfigurationLayerInfoMSFT struct \"next\""
                 ,"");
      CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name
                          ,&local_140,&out);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)out._M_dataplus._M_p != &out.field_2) {
        operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
      }
      if (local_140.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_140.
                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_140.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_140.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)error_message._M_dataplus._M_p != &error_message.field_2) goto LAB_0019cea2;
      goto LAB_0019ceaf;
    }
    if (encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(encountered_structs.
                      super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)encountered_structs.
                            super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)encountered_structs.
                            super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(duplicate_ext_structs.
                      super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)duplicate_ext_structs.
                            super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)duplicate_ext_structs.
                            super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(valid_ext_structs.
                      super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)valid_ext_structs.
                            super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)valid_ext_structs.
                            super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (!check_members || XVar9 != XR_SUCCESS) {
    return XVar9;
  }
  error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&error_message,"XrSecondaryViewConfigurationLayerInfoMSFT","");
  paVar1 = &out.field_2;
  out._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&out,"viewConfigurationType","");
  bVar5 = ValidateXrEnum(instance_info,command_name,&error_message,&out,objects_info,
                         value->viewConfigurationType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)out._M_dataplus._M_p != paVar1) {
    operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)error_message._M_dataplus._M_p != &error_message.field_2) {
    operator_delete(error_message._M_dataplus._M_p,error_message.field_2._M_allocated_capacity + 1);
  }
  if (!bVar5) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&error_message,
               "XrSecondaryViewConfigurationLayerInfoMSFT contains invalid XrViewConfigurationType \"viewConfigurationType\" enum value "
               ,0x76);
    local_3a0._M_dataplus._M_p._0_4_ = value->viewConfigurationType;
    out._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&out,'\n');
    *out._M_dataplus._M_p = '0';
    out._M_dataplus._M_p[1] = 'x';
    pcVar11 = out._M_dataplus._M_p +
              CONCAT44(out._M_string_length._4_4_,(uint)out._M_string_length) + -1;
    lVar13 = 0;
    do {
      bVar2 = *(byte *)((long)&local_3a0._M_dataplus._M_p + lVar13);
      *pcVar11 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
      pcVar11[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
      lVar13 = lVar13 + 1;
      pcVar11 = pcVar11 + -2;
    } while (lVar13 != 4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&error_message,out._M_dataplus._M_p,
               CONCAT44(out._M_string_length._4_4_,(uint)out._M_string_length));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out._M_dataplus._M_p != paVar1) {
      operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
    }
    out._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&out,
               "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-viewConfigurationType-parameter","");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_170,objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,&local_170,
                        &local_3a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
    }
    if (local_170.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_170.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_170.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_170.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out._M_dataplus._M_p != paVar1) {
      operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
    }
LAB_0019e4b7:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
    std::ios_base::~ios_base(local_310);
    return XR_ERROR_VALIDATION_FAILURE;
  }
  error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&error_message,"XrSecondaryViewConfigurationLayerInfoMSFT","");
  out._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&out,"environmentBlendMode","");
  XVar3 = value->environmentBlendMode;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)out._M_dataplus._M_p != paVar1) {
    operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)error_message._M_dataplus._M_p != &error_message.field_2) {
    operator_delete(error_message._M_dataplus._M_p,error_message.field_2._M_allocated_capacity + 1);
  }
  if (2 < XVar3 - XR_ENVIRONMENT_BLEND_MODE_OPAQUE) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&error_message,
               "XrSecondaryViewConfigurationLayerInfoMSFT contains invalid XrEnvironmentBlendMode \"environmentBlendMode\" enum value "
               ,0x74);
    paVar1 = &out.field_2;
    local_3a0._M_dataplus._M_p._0_4_ = value->environmentBlendMode;
    out._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&out,'\n');
    *out._M_dataplus._M_p = '0';
    out._M_dataplus._M_p[1] = 'x';
    pcVar11 = out._M_dataplus._M_p +
              CONCAT44(out._M_string_length._4_4_,(uint)out._M_string_length) + -1;
    lVar13 = 0;
    do {
      bVar2 = *(byte *)((long)&local_3a0._M_dataplus._M_p + lVar13);
      *pcVar11 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
      pcVar11[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
      lVar13 = lVar13 + 1;
      pcVar11 = pcVar11 + -2;
    } while (lVar13 != 4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&error_message,out._M_dataplus._M_p,
               CONCAT44(out._M_string_length._4_4_,(uint)out._M_string_length));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out._M_dataplus._M_p != paVar1) {
      operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
    }
    out._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&out,
               "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-environmentBlendMode-parameter","");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_188,objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,&local_188,
                        &local_3a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
    }
    if (local_188.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_188.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_188.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_188.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out._M_dataplus._M_p != paVar1) {
      operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
    }
    goto LAB_0019e4b7;
  }
  XVar9 = XR_SUCCESS;
  paVar1 = &out.field_2;
  if ((value->layerCount == 0) && (value->layers != (XrCompositionLayerBaseHeader **)0x0)) {
    error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&error_message,
               "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layerCount-arraylength","");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_1a0,objects_info);
    out._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&out,
               "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layerCount is non-optional and must be greater than 0"
               ,"");
    CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        &local_1a0,&out);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out._M_dataplus._M_p != paVar1) {
      operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
    }
    if (local_1a0.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1a0.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1a0.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1a0.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)error_message._M_dataplus._M_p != &error_message.field_2) {
      operator_delete(error_message._M_dataplus._M_p,error_message.field_2._M_allocated_capacity + 1
                     );
    }
    XVar9 = XR_ERROR_VALIDATION_FAILURE;
  }
  if (value->layers == (XrCompositionLayerBaseHeader **)0x0) {
    if (value->layerCount == 0) {
      return XVar9;
    }
    error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&error_message,
               "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter","");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_1b8,objects_info);
    out._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&out,
               "XrSecondaryViewConfigurationLayerInfoMSFT contains invalid NULL for XrCompositionLayerBaseHeader \"layers\" is which not optional since \"layerCount\" is set and must be non-NULL"
               ,"");
    CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        &local_1b8,&out);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out._M_dataplus._M_p != paVar1) {
      operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
    }
    if (local_1b8.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_0019e6b8;
    uVar15 = (long)local_1b8.
                   super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
             (long)local_1b8.
                   super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    if (value->layerCount == 0) {
      return XVar9;
    }
    uVar15 = 0;
    while( true ) {
      __val = (uint)uVar15;
      value_00 = (XrCompositionLayerProjection *)value->layers[uVar15];
      if (value_00 == (XrCompositionLayerProjection *)0x0) break;
      iVar8 = 0;
      if (value_00->type == XR_TYPE_COMPOSITION_LAYER_PROJECTION) {
        XVar9 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,value_00
                                );
        if (XVar9 == XR_SUCCESS) {
          XVar9 = XR_SUCCESS;
          iVar8 = 4;
        }
        else {
          error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&error_message,
                     "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers","");
          std::__cxx11::string::append((char *)&error_message);
          cVar6 = '\x01';
          if (9 < __val) {
            uVar14 = uVar15;
            cVar4 = '\x04';
            do {
              cVar6 = cVar4;
              uVar12 = (uint)uVar14;
              if (uVar12 < 100) {
                cVar6 = cVar6 + -2;
                goto LAB_0019d21f;
              }
              if (uVar12 < 1000) {
                cVar6 = cVar6 + -1;
                goto LAB_0019d21f;
              }
              if (uVar12 < 10000) goto LAB_0019d21f;
              uVar14 = uVar14 / 10000;
              cVar4 = cVar6 + '\x04';
            } while (99999 < uVar12);
            cVar6 = cVar6 + '\x01';
          }
LAB_0019d21f:
          out._M_dataplus._M_p = (pointer)&out.field_2;
          std::__cxx11::string::_M_construct((ulong)&out,cVar6);
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (out._M_dataplus._M_p,(uint)out._M_string_length,__val);
          std::__cxx11::string::_M_append((char *)&error_message,(ulong)out._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)out._M_dataplus._M_p != &out.field_2) {
            operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&error_message);
          std::__cxx11::string::append((char *)&error_message);
          out._M_dataplus._M_p = (pointer)&out.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&out,
                     "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter","");
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    (&local_48,objects_info);
          CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                              &local_48,&error_message);
          if (local_48.
              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_48.
                                  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_48.
                                  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)out._M_dataplus._M_p != &out.field_2) {
            operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)error_message._M_dataplus._M_p != &error_message.field_2) {
            operator_delete(error_message._M_dataplus._M_p,
                            error_message.field_2._M_allocated_capacity + 1);
          }
          iVar8 = 1;
        }
      }
      if (iVar8 != 4) {
        if (iVar8 != 0) {
          return XR_ERROR_VALIDATION_FAILURE;
        }
        iVar8 = 0;
        if (((XrCompositionLayerQuad *)value->layers[uVar15])->type ==
            XR_TYPE_COMPOSITION_LAYER_QUAD) {
          XVar9 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                   (XrCompositionLayerQuad *)value->layers[uVar15]);
          if (XVar9 == XR_SUCCESS) {
            XVar9 = XR_SUCCESS;
            iVar8 = 4;
          }
          else {
            error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&error_message,
                       "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers","");
            std::__cxx11::string::append((char *)&error_message);
            cVar6 = '\x01';
            if (9 < __val) {
              uVar14 = uVar15;
              cVar4 = '\x04';
              do {
                cVar6 = cVar4;
                uVar12 = (uint)uVar14;
                if (uVar12 < 100) {
                  cVar6 = cVar6 + -2;
                  goto LAB_0019d42f;
                }
                if (uVar12 < 1000) {
                  cVar6 = cVar6 + -1;
                  goto LAB_0019d42f;
                }
                if (uVar12 < 10000) goto LAB_0019d42f;
                uVar14 = uVar14 / 10000;
                cVar4 = cVar6 + '\x04';
              } while (99999 < uVar12);
              cVar6 = cVar6 + '\x01';
            }
LAB_0019d42f:
            out._M_dataplus._M_p = (pointer)&out.field_2;
            std::__cxx11::string::_M_construct((ulong)&out,cVar6);
            std::__detail::__to_chars_10_impl<unsigned_int>
                      (out._M_dataplus._M_p,(uint)out._M_string_length,__val);
            std::__cxx11::string::_M_append((char *)&error_message,(ulong)out._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)out._M_dataplus._M_p != &out.field_2) {
              operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::string::append((char *)&error_message);
            std::__cxx11::string::append((char *)&error_message);
            out._M_dataplus._M_p = (pointer)&out.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&out,
                       "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter","");
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            vector(&local_60,objects_info);
            CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                                &local_60,&error_message);
            if (local_60.
                super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_60.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_60.
                                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_60.
                                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)out._M_dataplus._M_p != &out.field_2) {
              operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)error_message._M_dataplus._M_p != &error_message.field_2) {
              operator_delete(error_message._M_dataplus._M_p,
                              error_message.field_2._M_allocated_capacity + 1);
            }
            iVar8 = 1;
          }
        }
        if (iVar8 != 4) {
          if (iVar8 != 0) {
            return XR_ERROR_VALIDATION_FAILURE;
          }
          iVar8 = 0;
          if (((XrCompositionLayerCubeKHR *)value->layers[uVar15])->type ==
              XR_TYPE_COMPOSITION_LAYER_CUBE_KHR) {
            XVar9 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                     (XrCompositionLayerCubeKHR *)value->layers[uVar15]);
            if (XVar9 == XR_SUCCESS) {
              XVar9 = XR_SUCCESS;
              iVar8 = 4;
            }
            else {
              error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&error_message,
                         "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers","");
              std::__cxx11::string::append((char *)&error_message);
              cVar6 = '\x01';
              if (9 < __val) {
                uVar14 = uVar15;
                cVar4 = '\x04';
                do {
                  cVar6 = cVar4;
                  uVar12 = (uint)uVar14;
                  if (uVar12 < 100) {
                    cVar6 = cVar6 + -2;
                    goto LAB_0019d645;
                  }
                  if (uVar12 < 1000) {
                    cVar6 = cVar6 + -1;
                    goto LAB_0019d645;
                  }
                  if (uVar12 < 10000) goto LAB_0019d645;
                  uVar14 = uVar14 / 10000;
                  cVar4 = cVar6 + '\x04';
                } while (99999 < uVar12);
                cVar6 = cVar6 + '\x01';
              }
LAB_0019d645:
              out._M_dataplus._M_p = (pointer)&out.field_2;
              std::__cxx11::string::_M_construct((ulong)&out,cVar6);
              std::__detail::__to_chars_10_impl<unsigned_int>
                        (out._M_dataplus._M_p,(uint)out._M_string_length,__val);
              std::__cxx11::string::_M_append((char *)&error_message,(ulong)out._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)out._M_dataplus._M_p != &out.field_2) {
                operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::string::append((char *)&error_message);
              std::__cxx11::string::append((char *)&error_message);
              out._M_dataplus._M_p = (pointer)&out.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&out,
                         "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter","");
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              vector(&local_78,objects_info);
              CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                                  &local_78,&error_message);
              if (local_78.
                  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_78.
                                super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_78.
                                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_78.
                                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)out._M_dataplus._M_p != &out.field_2) {
                operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)error_message._M_dataplus._M_p != &error_message.field_2) {
                operator_delete(error_message._M_dataplus._M_p,
                                error_message.field_2._M_allocated_capacity + 1);
              }
              iVar8 = 1;
            }
          }
          if (iVar8 != 4) {
            if (iVar8 != 0) {
              return XR_ERROR_VALIDATION_FAILURE;
            }
            iVar8 = 0;
            if (((XrCompositionLayerCylinderKHR *)value->layers[uVar15])->type ==
                XR_TYPE_COMPOSITION_LAYER_CYLINDER_KHR) {
              XVar9 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                       (XrCompositionLayerCylinderKHR *)value->layers[uVar15]);
              if (XVar9 == XR_SUCCESS) {
                XVar9 = XR_SUCCESS;
                iVar8 = 4;
              }
              else {
                error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&error_message,
                           "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers","");
                std::__cxx11::string::append((char *)&error_message);
                cVar6 = '\x01';
                if (9 < __val) {
                  uVar14 = uVar15;
                  cVar4 = '\x04';
                  do {
                    cVar6 = cVar4;
                    uVar12 = (uint)uVar14;
                    if (uVar12 < 100) {
                      cVar6 = cVar6 + -2;
                      goto LAB_0019d85b;
                    }
                    if (uVar12 < 1000) {
                      cVar6 = cVar6 + -1;
                      goto LAB_0019d85b;
                    }
                    if (uVar12 < 10000) goto LAB_0019d85b;
                    uVar14 = uVar14 / 10000;
                    cVar4 = cVar6 + '\x04';
                  } while (99999 < uVar12);
                  cVar6 = cVar6 + '\x01';
                }
LAB_0019d85b:
                out._M_dataplus._M_p = (pointer)&out.field_2;
                std::__cxx11::string::_M_construct((ulong)&out,cVar6);
                std::__detail::__to_chars_10_impl<unsigned_int>
                          (out._M_dataplus._M_p,(uint)out._M_string_length,__val);
                std::__cxx11::string::_M_append((char *)&error_message,(ulong)out._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)out._M_dataplus._M_p != &out.field_2) {
                  operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::string::append((char *)&error_message);
                std::__cxx11::string::append((char *)&error_message);
                out._M_dataplus._M_p = (pointer)&out.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&out,
                           "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter","");
                std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
                vector(&local_90,objects_info);
                CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name
                                    ,&local_90,&error_message);
                if (local_90.
                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_90.
                                  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_90.
                                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_90.
                                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)out._M_dataplus._M_p != &out.field_2) {
                  operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)error_message._M_dataplus._M_p != &error_message.field_2) {
                  operator_delete(error_message._M_dataplus._M_p,
                                  error_message.field_2._M_allocated_capacity + 1);
                }
                iVar8 = 1;
              }
            }
            if (iVar8 != 4) {
              if (iVar8 != 0) {
                return XR_ERROR_VALIDATION_FAILURE;
              }
              iVar8 = 0;
              if (((XrCompositionLayerEquirectKHR *)value->layers[uVar15])->type ==
                  XR_TYPE_COMPOSITION_LAYER_EQUIRECT_KHR) {
                XVar9 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                         (XrCompositionLayerEquirectKHR *)value->layers[uVar15]);
                if (XVar9 == XR_SUCCESS) {
                  XVar9 = XR_SUCCESS;
                  iVar8 = 4;
                }
                else {
                  error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&error_message,
                             "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers","")
                  ;
                  std::__cxx11::string::append((char *)&error_message);
                  std::__cxx11::to_string(&out,__val);
                  std::__cxx11::string::_M_append
                            ((char *)&error_message,(ulong)out._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)out._M_dataplus._M_p != &out.field_2) {
                    operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::string::append((char *)&error_message);
                  std::__cxx11::string::append((char *)&error_message);
                  out._M_dataplus._M_p = (pointer)&out.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&out,
                             "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter","");
                  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                  ::vector(&local_a8,objects_info);
                  CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                      command_name,&local_a8,&error_message);
                  if (local_a8.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_a8.
                                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_a8.
                                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_a8.
                                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)out._M_dataplus._M_p != &out.field_2) {
                    operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)error_message._M_dataplus._M_p != &error_message.field_2) {
                    operator_delete(error_message._M_dataplus._M_p,
                                    error_message.field_2._M_allocated_capacity + 1);
                  }
                  iVar8 = 1;
                }
              }
              if (iVar8 != 4) {
                if (iVar8 != 0) {
                  return XR_ERROR_VALIDATION_FAILURE;
                }
                iVar8 = 0;
                if (((XrCompositionLayerEquirect2KHR *)value->layers[uVar15])->type ==
                    XR_TYPE_COMPOSITION_LAYER_EQUIRECT2_KHR) {
                  XVar9 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,
                                           true,(XrCompositionLayerEquirect2KHR *)
                                                value->layers[uVar15]);
                  if (XVar9 == XR_SUCCESS) {
                    XVar9 = XR_SUCCESS;
                    iVar8 = 4;
                  }
                  else {
                    error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&error_message,
                               "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers",
                               "");
                    std::__cxx11::string::append((char *)&error_message);
                    std::__cxx11::to_string(&out,__val);
                    std::__cxx11::string::_M_append
                              ((char *)&error_message,(ulong)out._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)out._M_dataplus._M_p != &out.field_2) {
                      operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
                    }
                    std::__cxx11::string::append((char *)&error_message);
                    std::__cxx11::string::append((char *)&error_message);
                    out._M_dataplus._M_p = (pointer)&out.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&out,
                               "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter","")
                    ;
                    std::
                    vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
                    vector(&local_c0,objects_info);
                    CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                        command_name,&local_c0,&error_message);
                    if (local_c0.
                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_c0.
                                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_c0.
                                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_c0.
                                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)out._M_dataplus._M_p != &out.field_2) {
                      operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)error_message._M_dataplus._M_p != &error_message.field_2) {
                      operator_delete(error_message._M_dataplus._M_p,
                                      error_message.field_2._M_allocated_capacity + 1);
                    }
                    iVar8 = 1;
                  }
                }
                if (iVar8 != 4) {
                  if (iVar8 != 0) {
                    return XR_ERROR_VALIDATION_FAILURE;
                  }
                  iVar8 = 0;
                  if (((XrCompositionLayerPassthroughFB *)value->layers[uVar15])->type ==
                      XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_FB) {
                    XVar9 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,
                                             true,(XrCompositionLayerPassthroughFB *)
                                                  value->layers[uVar15]);
                    if (XVar9 == XR_SUCCESS) {
                      XVar9 = XR_SUCCESS;
                      iVar8 = 4;
                    }
                    else {
                      error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&error_message,
                                 "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers"
                                 ,"");
                      std::__cxx11::string::append((char *)&error_message);
                      std::__cxx11::to_string(&out,__val);
                      std::__cxx11::string::_M_append
                                ((char *)&error_message,(ulong)out._M_dataplus._M_p);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)out._M_dataplus._M_p != &out.field_2) {
                        operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
                      }
                      std::__cxx11::string::append((char *)&error_message);
                      std::__cxx11::string::append((char *)&error_message);
                      out._M_dataplus._M_p = (pointer)&out.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&out,
                                 "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                                 "");
                      std::
                      vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ::vector(&local_d8,objects_info);
                      CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                          command_name,&local_d8,&error_message);
                      if (local_d8.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_d8.
                                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_d8.
                                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_d8.
                                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)out._M_dataplus._M_p != &out.field_2) {
                        operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)error_message._M_dataplus._M_p != &error_message.field_2) {
                        operator_delete(error_message._M_dataplus._M_p,
                                        error_message.field_2._M_allocated_capacity + 1);
                      }
                      iVar8 = 1;
                    }
                  }
                  if (iVar8 != 4) {
                    if (iVar8 != 0) {
                      return XR_ERROR_VALIDATION_FAILURE;
                    }
                    iVar8 = 0;
                    if (((XrCompositionLayerPassthroughHTC *)value->layers[uVar15])->type ==
                        XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_HTC) {
                      XVar9 = ValidateXrStruct(instance_info,command_name,objects_info,check_members
                                               ,true,(XrCompositionLayerPassthroughHTC *)
                                                     value->layers[uVar15]);
                      if (XVar9 == XR_SUCCESS) {
                        XVar9 = XR_SUCCESS;
                        iVar8 = 4;
                      }
                      else {
                        error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&error_message,
                                   "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers"
                                   ,"");
                        std::__cxx11::string::append((char *)&error_message);
                        std::__cxx11::to_string(&out,__val);
                        std::__cxx11::string::_M_append
                                  ((char *)&error_message,(ulong)out._M_dataplus._M_p);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)out._M_dataplus._M_p != &out.field_2) {
                          operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1
                                         );
                        }
                        std::__cxx11::string::append((char *)&error_message);
                        std::__cxx11::string::append((char *)&error_message);
                        out._M_dataplus._M_p = (pointer)&out.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&out,
                                   "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter"
                                   ,"");
                        std::
                        vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                        ::vector(&local_f0,objects_info);
                        CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                            command_name,&local_f0,&error_message);
                        if (local_f0.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                          operator_delete(local_f0.
                                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)local_f0.
                                                super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_f0.
                                                super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)out._M_dataplus._M_p != &out.field_2) {
                          operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1
                                         );
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)error_message._M_dataplus._M_p != &error_message.field_2) {
                          operator_delete(error_message._M_dataplus._M_p,
                                          error_message.field_2._M_allocated_capacity + 1);
                        }
                        iVar8 = 1;
                      }
                    }
                    if (iVar8 != 4) {
                      if (iVar8 != 0) {
                        return XR_ERROR_VALIDATION_FAILURE;
                      }
                      XVar10 = ValidateXrStruct(instance_info,command_name,objects_info,
                                                check_members,false,value->layers[uVar15]);
                      XVar9 = XR_SUCCESS;
                      if (XVar10 != XR_SUCCESS) {
                        error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&error_message,
                                   "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter"
                                   ,"");
                        std::
                        vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                        ::vector(&local_1e8,objects_info);
                        out._M_dataplus._M_p = (pointer)&out.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&out,
                                   "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers is invalid"
                                   ,"");
                        CoreValidLogMessage(instance_info,&error_message,
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,&local_1e8
                                            ,&out);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)out._M_dataplus._M_p != &out.field_2) {
                          operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1
                                         );
                        }
                        if (local_1e8.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                          operator_delete(local_1e8.
                                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)local_1e8.
                                                super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_1e8.
                                                super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)error_message._M_dataplus._M_p != &error_message.field_2) {
                          operator_delete(error_message._M_dataplus._M_p,
                                          error_message.field_2._M_allocated_capacity + 1);
                          return XVar10;
                        }
                        return XVar10;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      uVar15 = (ulong)(__val + 1);
      if (value->layerCount <= __val + 1) {
        return XVar9;
      }
    }
    error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&error_message,
               "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers","");
    std::__cxx11::string::append((char *)&error_message);
    paVar1 = &out.field_2;
    std::__cxx11::to_string(&out,__val);
    std::__cxx11::string::_M_append((char *)&error_message,(ulong)out._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out._M_dataplus._M_p != paVar1) {
      operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&error_message);
    std::__cxx11::string::append((char *)&error_message);
    out._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&out,"VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter","");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_1d0,objects_info);
    CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,&local_1d0,
                        &error_message);
    if (local_1d0.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1d0.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1d0.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1d0.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out._M_dataplus._M_p == paVar1) goto LAB_0019e6b8;
    uVar15 = out.field_2._M_allocated_capacity + 1;
    local_1b8.
    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)out._M_dataplus._M_p;
  }
  operator_delete(local_1b8.
                  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start,uVar15);
LAB_0019e6b8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)error_message._M_dataplus._M_p == &error_message.field_2) {
    return XR_ERROR_VALIDATION_FAILURE;
  }
  operator_delete(error_message._M_dataplus._M_p,error_message.field_2._M_allocated_capacity + 1);
  return XR_ERROR_VALIDATION_FAILURE;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrSecondaryViewConfigurationLayerInfoMSFT* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_SECONDARY_VIEW_CONFIGURATION_LAYER_INFO_MSFT) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrSecondaryViewConfigurationLayerInfoMSFT",
                             value->type, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-type-type", XR_TYPE_SECONDARY_VIEW_CONFIGURATION_LAYER_INFO_MSFT, "XR_TYPE_SECONDARY_VIEW_CONFIGURATION_LAYER_INFO_MSFT");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrSecondaryViewConfigurationLayerInfoMSFT struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrSecondaryViewConfigurationLayerInfoMSFT : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrSecondaryViewConfigurationLayerInfoMSFT struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Make sure the enum type XrViewConfigurationType value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrSecondaryViewConfigurationLayerInfoMSFT", "viewConfigurationType", objects_info, value->viewConfigurationType)) {
        std::ostringstream oss_enum;
        oss_enum << "XrSecondaryViewConfigurationLayerInfoMSFT contains invalid XrViewConfigurationType \"viewConfigurationType\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->viewConfigurationType));
        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-viewConfigurationType-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Make sure the enum type XrEnvironmentBlendMode value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrSecondaryViewConfigurationLayerInfoMSFT", "environmentBlendMode", objects_info, value->environmentBlendMode)) {
        std::ostringstream oss_enum;
        oss_enum << "XrSecondaryViewConfigurationLayerInfoMSFT contains invalid XrEnvironmentBlendMode \"environmentBlendMode\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->environmentBlendMode));
        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-environmentBlendMode-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Non-optional array length must be non-zero
    if (0 >= value->layerCount && nullptr != value->layers) {
        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layerCount-arraylength",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layerCount is non-optional and must be greater than 0");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    // Pointer/array variable with a length variable.  Make sure that
    // if length variable is non-zero that the pointer is not NULL
    if (nullptr == value->layers && 0 != value->layerCount) {
        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrSecondaryViewConfigurationLayerInfoMSFT contains invalid NULL for XrCompositionLayerBaseHeader \"layers\" is which not "
                            "optional since \"layerCount\" is set and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    if (value->layers) {
        for (uint32_t value_layers_inc = 0; value_layers_inc < value->layerCount; ++value_layers_inc) {
            if (value->layers[value_layers_inc] == nullptr) {
                std::string error_message = "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers";
                error_message += "[";
                error_message += std::to_string(value_layers_inc);
                error_message += "]";
                error_message += " is null";
                CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    error_message);
                return XR_ERROR_VALIDATION_FAILURE;
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerProjection and it is valid
            {
                const XrCompositionLayerProjection* const* new_compositionlayerprojection_value = reinterpret_cast<const XrCompositionLayerProjection* const*>(value->layers);
                if (new_compositionlayerprojection_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_PROJECTION) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_compositionlayerprojection_value[value_layers_inc]);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers";
                        error_message += "[";
                        error_message += std::to_string(value_layers_inc);
                        error_message += "]";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        break;
                    } else {
                        continue;
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerQuad and it is valid
            {
                const XrCompositionLayerQuad* const* new_compositionlayerquad_value = reinterpret_cast<const XrCompositionLayerQuad* const*>(value->layers);
                if (new_compositionlayerquad_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_QUAD) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_compositionlayerquad_value[value_layers_inc]);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers";
                        error_message += "[";
                        error_message += std::to_string(value_layers_inc);
                        error_message += "]";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        break;
                    } else {
                        continue;
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerCubeKHR and it is valid
            {
                const XrCompositionLayerCubeKHR* const* new_compositionlayercubekhr_value = reinterpret_cast<const XrCompositionLayerCubeKHR* const*>(value->layers);
                if (new_compositionlayercubekhr_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_CUBE_KHR) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_compositionlayercubekhr_value[value_layers_inc]);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers";
                        error_message += "[";
                        error_message += std::to_string(value_layers_inc);
                        error_message += "]";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        break;
                    } else {
                        continue;
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerCylinderKHR and it is valid
            {
                const XrCompositionLayerCylinderKHR* const* new_compositionlayercylinderkhr_value = reinterpret_cast<const XrCompositionLayerCylinderKHR* const*>(value->layers);
                if (new_compositionlayercylinderkhr_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_CYLINDER_KHR) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_compositionlayercylinderkhr_value[value_layers_inc]);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers";
                        error_message += "[";
                        error_message += std::to_string(value_layers_inc);
                        error_message += "]";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        break;
                    } else {
                        continue;
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerEquirectKHR and it is valid
            {
                const XrCompositionLayerEquirectKHR* const* new_compositionlayerequirectkhr_value = reinterpret_cast<const XrCompositionLayerEquirectKHR* const*>(value->layers);
                if (new_compositionlayerequirectkhr_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_EQUIRECT_KHR) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_compositionlayerequirectkhr_value[value_layers_inc]);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers";
                        error_message += "[";
                        error_message += std::to_string(value_layers_inc);
                        error_message += "]";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        break;
                    } else {
                        continue;
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerEquirect2KHR and it is valid
            {
                const XrCompositionLayerEquirect2KHR* const* new_compositionlayerequirect2khr_value = reinterpret_cast<const XrCompositionLayerEquirect2KHR* const*>(value->layers);
                if (new_compositionlayerequirect2khr_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_EQUIRECT2_KHR) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_compositionlayerequirect2khr_value[value_layers_inc]);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers";
                        error_message += "[";
                        error_message += std::to_string(value_layers_inc);
                        error_message += "]";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        break;
                    } else {
                        continue;
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerPassthroughFB and it is valid
            {
                const XrCompositionLayerPassthroughFB* const* new_compositionlayerpassthroughfb_value = reinterpret_cast<const XrCompositionLayerPassthroughFB* const*>(value->layers);
                if (new_compositionlayerpassthroughfb_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_FB) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_compositionlayerpassthroughfb_value[value_layers_inc]);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers";
                        error_message += "[";
                        error_message += std::to_string(value_layers_inc);
                        error_message += "]";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        break;
                    } else {
                        continue;
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerPassthroughHTC and it is valid
            {
                const XrCompositionLayerPassthroughHTC* const* new_compositionlayerpassthroughhtc_value = reinterpret_cast<const XrCompositionLayerPassthroughHTC* const*>(value->layers);
                if (new_compositionlayerpassthroughhtc_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_HTC) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_compositionlayerpassthroughhtc_value[value_layers_inc]);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers";
                        error_message += "[";
                        error_message += std::to_string(value_layers_inc);
                        error_message += "]";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        break;
                    } else {
                        continue;
                    }
                }
            }
            // Validate that the base-structure XrCompositionLayerBaseHeader is valid
            xr_result = ValidateXrStruct(instance_info, command_name, objects_info,
                                                             check_members, true, value->layers[value_layers_inc]);
            if (XR_SUCCESS != xr_result) {
                CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers is invalid");
                return xr_result;
            }
        }
    }
    // Everything checked out properly
    return xr_result;
}